

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  int *piVar1;
  uchar *puVar2;
  uint *puVar3;
  void *pvVar4;
  uint *puVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  Mat *pMVar9;
  size_t sVar10;
  size_t __n;
  
  clear(this);
  puVar3 = (uint *)*mem;
  uVar7 = *puVar3;
  while( true ) {
    puVar5 = puVar3 + 1;
    *mem = (uchar *)puVar5;
    if (uVar7 == 0xffffff17) break;
    uVar8 = -(uVar7 + 0x5b04);
    if ((int)uVar7 < -0x5b03) {
      uVar7 = *puVar5;
      sVar10 = (size_t)(int)uVar7;
      *mem = (uchar *)(puVar3 + 2);
      pMVar9 = &this->params[uVar8].v;
      if (((this->params[uVar8].v.dims != 1) || (this->params[uVar8].v.w != uVar7)) ||
         (this->params[uVar8].v.elemsize != 4)) {
        piVar1 = this->params[uVar8].v.refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (pMVar9->data != (void *)0x0)) {
            free(*(void **)((long)pMVar9->data + -8));
          }
        }
        pMVar9->data = (void *)0x0;
        this->params[uVar8].v.refcount = (int *)0x0;
        this->params[uVar8].v.elemsize = 4;
        this->params[uVar8].v.dims = 1;
        this->params[uVar8].v.w = uVar7;
        this->params[uVar8].v.h = 1;
        this->params[uVar8].v.c = 1;
        this->params[uVar8].v.cstep = sVar10;
        if (uVar7 != 0) {
          pvVar4 = malloc(sVar10 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar4;
          pMVar9->data = pvVar6;
          piVar1 = (int *)((long)pvVar6 + sVar10 * 4);
          this->params[uVar8].v.refcount = piVar1;
          *piVar1 = 1;
        }
      }
      __n = sVar10 << 2;
      memcpy(pMVar9->data,*mem,__n);
      uVar7 = uVar8;
    }
    else {
      this->params[(int)uVar7].field_1.i = *puVar5;
      __n = 4;
    }
    puVar2 = *mem;
    puVar3 = (uint *)(puVar2 + __n);
    this->params[(int)uVar7].loaded = 1;
    uVar7 = *(uint *)(puVar2 + __n);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}